

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::membrane
          (anon_unknown_0 *this,Own<capnp::ClientHook> *inner,MembranePolicy *policy,bool reverse)

{
  Disposer *pDVar1;
  ClientHook *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  long *plVar5;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> *this_00;
  Own<capnp::ClientHook> OVar6;
  Own<capnp::ClientHook> local_88;
  Own<capnp::ClientHook> local_78;
  Own<capnp::ClientHook> local_68;
  ClientHook *local_58;
  Own<capnp::ClientHook> local_50;
  Own<capnp::ClientHook> local_40;
  undefined4 extraout_var_00;
  
  local_68.disposer = inner->disposer;
  local_68.ptr = inner->ptr;
  inner->ptr = (ClientHook *)0x0;
  iVar3 = (*(local_68.ptr)->_vptr_ClientHook[5])();
  pCVar2 = local_68.ptr;
  if ((undefined1 *)CONCAT44(extraout_var,iVar3) == &(anonymous_namespace)::DUMMY) {
    iVar3 = (*policy->_vptr_MembranePolicy[6])(policy);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
    plVar5 = (long *)(**(code **)(*pCVar2[6]._vptr_ClientHook + 0x30))();
    if ((plVar5 == plVar4) && ((bool)*(char *)&pCVar2[7]._vptr_ClientHook == !reverse)) {
      (**(code **)(*pCVar2[4]._vptr_ClientHook + 0x20))(&local_88);
      pDVar1 = local_88.disposer;
      local_58 = local_88.ptr;
      local_78.disposer = local_88.disposer;
      local_88.ptr = (ClientHook *)0x0;
      kj::Own<capnp::ClientHook>::dispose(&local_88);
      if (reverse) {
        local_78.ptr = (ClientHook *)0x0;
        local_50.disposer = pDVar1;
        local_50.ptr = local_58;
        (**(code **)(*plVar4 + 0x38))(&local_88,plVar4,&local_50,pCVar2[6]._vptr_ClientHook,policy);
      }
      else {
        local_78.ptr = (ClientHook *)0x0;
        local_40.disposer = pDVar1;
        local_40.ptr = local_58;
        (**(code **)(*plVar4 + 0x40))(&local_88,plVar4,&local_40,pCVar2[6]._vptr_ClientHook,policy);
      }
      *(Disposer **)this = local_88.disposer;
      *(ClientHook **)(this + 8) = local_88.ptr;
      local_88.ptr = (ClientHook *)0x0;
      if (reverse) {
        kj::Own<capnp::ClientHook>::dispose(&local_88);
        kj::Own<capnp::ClientHook>::dispose(&local_50);
      }
      else {
        kj::Own<capnp::ClientHook>::dispose(&local_88);
        kj::Own<capnp::ClientHook>::dispose(&local_40);
      }
      kj::Own<capnp::ClientHook>::dispose(&local_78);
      goto LAB_003eed1c;
    }
  }
  if (reverse) {
    local_88.disposer = local_68.disposer;
    local_88.ptr = local_68.ptr;
    local_68.ptr = (ClientHook *)0x0;
    (*policy->_vptr_MembranePolicy[4])(&local_78,policy);
  }
  else {
    local_50.disposer = local_68.disposer;
    local_50.ptr = local_68.ptr;
    local_68.ptr = (ClientHook *)0x0;
    (*policy->_vptr_MembranePolicy[5])(&local_78,policy);
  }
  *(Disposer **)this = local_78.disposer;
  *(ClientHook **)(this + 8) = local_78.ptr;
  local_78.ptr = (ClientHook *)0x0;
  if (reverse) {
    kj::Own<capnp::ClientHook>::dispose(&local_78);
    this_00 = &local_88;
  }
  else {
    kj::Own<capnp::ClientHook>::dispose(&local_78);
    this_00 = &local_50;
  }
  kj::Own<capnp::ClientHook>::dispose(this_00);
LAB_003eed1c:
  kj::Own<capnp::ClientHook>::dispose(&local_68);
  OVar6.ptr = extraout_RDX;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<ClientHook> membrane(kj::Own<ClientHook> inner, MembranePolicy& policy, bool reverse) {
  return MembraneHook::wrap(kj::mv(inner), policy, reverse);
}